

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

int ssh1_channelfind(void *av,void *bv)

{
  ssh1_channel *b;
  uint *a;
  void *bv_local;
  void *av_local;
  
  if (*av < *(uint *)((long)bv + 0xc)) {
    av_local._4_4_ = -1;
  }
  else if (*(uint *)((long)bv + 0xc) < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int ssh1_channelfind(void *av, void *bv)
{
    const unsigned *a = (const unsigned *) av;
    const struct ssh1_channel *b = (const struct ssh1_channel *) bv;
    if (*a < b->localid)
        return -1;
    if (*a > b->localid)
        return +1;
    return 0;
}